

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
::AssertHashEqConsistent<int>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
           *this,int *key)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  slot_type *psVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  uint uVar11;
  ushort uVar12;
  
  if (1 < (this->settings_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)*key;
    uVar8 = SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),8) ^
            SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar9 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    if (uVar9 == 1) {
      psVar7 = soo_slot(this);
      if (((psVar7->value).first == *key) &&
         (auVar5._8_8_ = 0,
         auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed +
                        (ulong)(uint)(psVar7->value).first,
         uVar8 != (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                  SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0)))) {
LAB_002d900a:
        __assert_fail("hash_of_arg == once_more_hash_arg && \"hash is not idempotent.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf10,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>>::AssertHashEqConsistent(const int &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>]"
                     );
      }
    }
    else {
      if (uVar9 == 0) {
        __assert_fail("!kEnabled || cap >= kCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb37,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>]"
                     );
      }
      if (uVar9 < 0x11) {
        psVar7 = slot_array(this);
        uVar9 = (this->settings_).
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
        pauVar10 = (undefined1 (*) [16])
                   (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar9 < 0xf) {
          if (8 < uVar9) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<int, const google::protobuf::json_internal::ResolverPool::Field *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar9 = *(ulong *)(*pauVar10 + uVar9) & 0x8080808080808080;
          if (uVar9 != 0x8080808080808080) {
            uVar9 = uVar9 ^ 0x8080808080808080;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)*key;
            do {
              lVar2 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                }
              }
              if ((*(uint *)((long)psVar7 + (ulong)((uint)lVar2 & 0xfffffff8) * 2 + -0x10) == *key)
                 && (uVar8 != (SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
                              SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_002d900a;
              uVar9 = uVar9 & uVar9 - 1;
            } while (uVar9 != 0);
          }
        }
        else {
          uVar9 = (this->settings_).
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.size_;
          if (1 < uVar9) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)*key;
            uVar9 = uVar9 >> 1;
            do {
              auVar3 = *pauVar10;
              uVar11 = (uint)(ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar3[0xf] >> 7) << 0xf);
              if (uVar11 != 0xffff) {
                uVar11 = ~uVar11;
                do {
                  uVar1 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
                    }
                  }
                  if ((char)(*pauVar10)[uVar1] < '\0') {
                    __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x764,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<int, const google::protobuf::json_internal::ResolverPool::Field *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                                 );
                  }
                  if ((*(uint *)((long)psVar7 + (ulong)(uVar1 << 4)) == *key) &&
                     (uVar8 != (SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
                               SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_002d900a;
                  uVar9 = uVar9 - 1;
                  uVar12 = (ushort)(uVar11 - 1) & (ushort)uVar11;
                  uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar12);
                } while (uVar12 != 0);
                if (uVar9 == 0) {
                  return;
                }
              }
              pauVar10 = pauVar10 + 1;
              psVar7 = psVar7 + 0x10;
              if (auVar3[0xf] == 0xff) {
                __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x76b,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<int, const google::protobuf::json_internal::ResolverPool::Field *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
            } while( true );
          }
        }
      }
    }
  }
  return;
}

Assistant:

size_t capacity() const {
    const size_t cap = common().capacity();
    // Compiler complains when using functions in assume so use local variables.
    ABSL_ATTRIBUTE_UNUSED static constexpr bool kEnabled = SooEnabled();
    ABSL_ATTRIBUTE_UNUSED static constexpr size_t kCapacity = SooCapacity();
    ABSL_ASSUME(!kEnabled || cap >= kCapacity);
    return cap;
  }